

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::ModuloOperator,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t hVar11;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      hVar11.upper = *(int64_t *)((long)&ldata->lower + lVar5);
      hVar11.lower = *(uint64_t *)((long)ldata + lVar5 + -8);
      right_01.upper = *(int64_t *)((long)&rdata->lower + lVar5);
      right_01.lower = *(uint64_t *)((long)rdata + lVar5 + -8);
      hVar11 = ModuloOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                         (hVar11,right_01);
      *(uint64_t *)((long)result_data + lVar5 + -8) = hVar11.lower;
      *(int64_t *)((long)&result_data->lower + lVar5) = hVar11.upper;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    uVar4 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
LAB_01835e4e:
        uVar8 = uVar4 << 4 | 8;
        for (; uVar2 = uVar4, uVar4 < uVar7; uVar4 = uVar4 + 1) {
          left.upper = *(int64_t *)((long)&ldata->lower + uVar8);
          left.lower = *(uint64_t *)((long)ldata + (uVar8 - 8));
          right.upper = *(int64_t *)((long)&rdata->lower + uVar8);
          right.lower = *(uint64_t *)((long)rdata + (uVar8 - 8));
          hVar11 = ModuloOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                             (left,right);
          *(uint64_t *)((long)result_data + (uVar8 - 8)) = hVar11.lower;
          *(int64_t *)((long)&result_data->lower + uVar8) = hVar11.upper;
          uVar8 = uVar8 + 0x10;
        }
      }
      else {
        uVar8 = puVar1[uVar3];
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
        if (uVar8 == 0xffffffffffffffff) goto LAB_01835e4e;
        uVar2 = uVar7;
        if (uVar8 != 0) {
          uVar6 = uVar4 << 4 | 8;
          for (uVar9 = 0; uVar2 = uVar4 + uVar9, uVar4 + uVar9 < uVar7; uVar9 = uVar9 + 1) {
            if ((uVar8 >> (uVar9 & 0x3f) & 1) != 0) {
              left_00.upper = *(int64_t *)((long)&ldata->lower + uVar6);
              left_00.lower = *(uint64_t *)((long)ldata + (uVar6 - 8));
              right_00.upper = *(int64_t *)((long)&rdata->lower + uVar6);
              right_00.lower = *(uint64_t *)((long)rdata + (uVar6 - 8));
              hVar11 = ModuloOperator::
                       Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                 (left_00,right_00);
              *(uint64_t *)((long)result_data + (uVar6 - 8)) = hVar11.lower;
              *(int64_t *)((long)&result_data->lower + uVar6) = hVar11.upper;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar4 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}